

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Serializer::MakeHeader
          (BP4Serializer *this,BufferSTL *b,string *fileType,bool isActive)

{
  size_t *psVar1;
  pointer pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  allocator local_1cc;
  allocator local_1cb;
  allocator local_1ca;
  allocator local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string fileTypeStr;
  string versionLongTag;
  string minorVersion;
  string patchVersion;
  string majorVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88 [4];
  char *local_68 [4];
  char *local_48 [4];
  
  if ((b->super_Buffer).m_Position != 0) {
    std::__cxx11::string::string((string *)&majorVersion,"Toolkit",(allocator *)&local_168);
    std::__cxx11::string::string((string *)&minorVersion,"format::bp::BP4Serializer",&local_1cb);
    std::__cxx11::string::string((string *)&patchVersion,"MakeHeader",&local_1cc);
    std::operator+(&local_1c8,"can only be called for an empty buffer. This one for ",fileType);
    std::operator+(&local_1a8,&local_1c8," already has content of ");
    std::__cxx11::to_string(&local_188,(b->super_Buffer).m_Position);
    std::operator+(&fileTypeStr,&local_1a8,&local_188);
    std::operator+(&versionLongTag,&fileTypeStr," bytes.");
    helper::Throw<std::invalid_argument>
              (&majorVersion,&minorVersion,&patchVersion,&versionLongTag,-1);
    std::__cxx11::string::~string((string *)&versionLongTag);
    std::__cxx11::string::~string((string *)&fileTypeStr);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&patchVersion);
    std::__cxx11::string::~string((string *)&minorVersion);
    std::__cxx11::string::~string((string *)&majorVersion);
  }
  sVar8 = BufferSTL::GetAvailableSize(b);
  if (sVar8 < 0x40) {
    sVar8 = (b->super_Buffer).m_Position;
    std::operator+(&local_a8,"BP4Serializer::MakeHeader ",fileType);
    BufferSTL::Resize(b,sVar8 + 0x40,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::to_string(&majorVersion,2);
  minorVersion._M_dataplus._M_p = (pointer)&minorVersion.field_2;
  std::__cxx11::string::_M_construct((ulong)&minorVersion,'\x01');
  std::__cxx11::to_string(&patchVersion,0);
  if ((b->super_Buffer).m_Position != 0) {
    std::__cxx11::string::string((string *)&versionLongTag,"Toolkit",(allocator *)&local_188);
    std::__cxx11::string::string
              ((string *)&fileTypeStr,"format::bp::BP4Serializer",(allocator *)&local_168);
    std::__cxx11::string::string((string *)&local_1a8,"MakeHeader",&local_1cb);
    std::__cxx11::string::string((string *)&local_1c8,"Version Tag position mismatch",&local_1cc);
    helper::Throw<std::runtime_error>(&versionLongTag,&fileTypeStr,&local_1a8,&local_1c8,-1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&fileTypeStr);
    std::__cxx11::string::~string((string *)&versionLongTag);
  }
  std::operator+(&local_168,"ADIOS-BP v",&majorVersion);
  std::operator+(&local_188,&local_168,".");
  std::operator+(&local_1c8,&local_188,&minorVersion);
  std::operator+(&local_1a8,&local_1c8,".");
  std::operator+(&fileTypeStr,&local_1a8,&patchVersion);
  std::operator+(&versionLongTag,&fileTypeStr," ");
  std::__cxx11::string::~string((string *)&fileTypeStr);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::substr((ulong)&fileTypeStr,(ulong)fileType);
  std::__cxx11::string::append((string *)&versionLongTag);
  if (versionLongTag._M_string_length < 0x20) {
    if (versionLongTag._M_string_length != 0) {
      memmove((b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + (b->super_Buffer).m_Position,
              versionLongTag._M_dataplus._M_p,versionLongTag._M_string_length);
    }
  }
  else {
    sVar8 = (b->super_Buffer).m_Position;
    pcVar3 = (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)versionLongTag._M_dataplus._M_p;
    uVar5 = *(undefined8 *)(versionLongTag._M_dataplus._M_p + 8);
    uVar6 = *(undefined8 *)(versionLongTag._M_dataplus._M_p + 0x18);
    pcVar2 = pcVar3 + sVar8 + 0x10;
    *(undefined8 *)pcVar2 = *(undefined8 *)(versionLongTag._M_dataplus._M_p + 0x10);
    *(undefined8 *)(pcVar2 + 8) = uVar6;
    pcVar3 = pcVar3 + sVar8;
    *(undefined8 *)pcVar3 = uVar4;
    *(undefined8 *)(pcVar3 + 8) = uVar5;
  }
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 0x20;
  std::__cxx11::string::string((string *)local_48,(string *)&majorVersion);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_48[0];
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string((string *)local_68,(string *)&minorVersion);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_68[0];
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string((string *)local_88,(string *)&patchVersion);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_88[0];
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::~string((string *)local_88);
  sVar8 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar8;
  if (sVar8 != 0x24) {
    std::__cxx11::string::string((string *)&local_1a8,"Toolkit",&local_1cb);
    std::__cxx11::string::string((string *)&local_1c8,"format::bp::BP4Serializer",&local_1cc);
    std::__cxx11::string::string((string *)&local_188,"MakeHeader",&local_1c9);
    std::__cxx11::string::string((string *)&local_168,"Endian Flag position mismatch",&local_1ca);
    helper::Throw<std::runtime_error>(&local_1a8,&local_1c8,&local_188,&local_168,-1);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  bVar7 = helper::IsLittleEndian();
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = !bVar7;
  sVar8 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar8;
  if (sVar8 == 0x25) {
    sVar8 = 0x25;
  }
  else {
    std::__cxx11::string::string((string *)&local_1a8,"Toolkit",&local_1cb);
    std::__cxx11::string::string((string *)&local_1c8,"format::bp::BP4Serializer",&local_1cc);
    std::__cxx11::string::string((string *)&local_188,"MakeHeader",&local_1c9);
    std::__cxx11::string::string((string *)&local_168,"Active Flag position mismatch",&local_1ca);
    helper::Throw<std::runtime_error>(&local_1a8,&local_1c8,&local_188,&local_168,-1);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    sVar8 = (b->super_Buffer).m_Position;
  }
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar8] = '\x04';
  sVar8 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar8;
  if (sVar8 == 0x26) {
    sVar8 = 0x26;
  }
  else {
    std::__cxx11::string::string((string *)&local_1a8,"Toolkit",&local_1cb);
    std::__cxx11::string::string((string *)&local_1c8,"format::bp::BP4Serializer",&local_1cc);
    std::__cxx11::string::string((string *)&local_188,"MakeHeader",&local_1c9);
    std::__cxx11::string::string((string *)&local_168,"Active Flag position mismatch",&local_1ca);
    helper::Throw<std::runtime_error>(&local_1a8,&local_1c8,&local_188,&local_168,-1);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    sVar8 = (b->super_Buffer).m_Position;
  }
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar8] = isActive;
  sVar8 = (b->super_Buffer).m_Position + 0x1a;
  (b->super_Buffer).m_Position = sVar8;
  (b->super_Buffer).m_AbsolutePosition = sVar8;
  std::__cxx11::string::~string((string *)&fileTypeStr);
  std::__cxx11::string::~string((string *)&versionLongTag);
  std::__cxx11::string::~string((string *)&patchVersion);
  std::__cxx11::string::~string((string *)&minorVersion);
  std::__cxx11::string::~string((string *)&majorVersion);
  return;
}

Assistant:

void BP4Serializer::MakeHeader(BufferSTL &b, const std::string fileType, const bool isActive)
{
    auto lf_CopyVersionChar = [](const std::string version, std::vector<char> &buffer,
                                 size_t &position) {
        helper::CopyToBuffer(buffer, position, version.c_str());
    };

    auto &buffer = b.m_Buffer;
    auto &position = b.m_Position;
    auto &absolutePosition = b.m_AbsolutePosition;
    if (position > 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                             "can only be called for an empty "
                                             "buffer. This one for " +
                                                 fileType + " already has content of " +
                                                 std::to_string(position) + " bytes.");
    }

    if (b.GetAvailableSize() < 64)
    {
        b.Resize(position + 64, "BP4Serializer::MakeHeader " + fileType);
    }

    const std::string majorVersion(std::to_string(ADIOS2_VERSION_MAJOR));
    const char minorVersionChar = '0' + ADIOS2_VERSION_MINOR;
    const std::string minorVersion(1, minorVersionChar);
    const std::string patchVersion(std::to_string(ADIOS2_VERSION_PATCH));

    // byte 0-31: Readable tag
    if (position != m_VersionTagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Version Tag "
                                          "position mismatch");
    }
    std::string versionLongTag("ADIOS-BP v" + majorVersion + "." + minorVersion + "." +
                               patchVersion + " ");
    size_t maxTypeLen = m_VersionTagLength - versionLongTag.size();
    const std::string fileTypeStr = fileType.substr(0, maxTypeLen);
    versionLongTag += fileTypeStr;
    const size_t versionLongTagSize = versionLongTag.size();
    if (versionLongTagSize < m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), versionLongTagSize);
        position += m_VersionTagLength - versionLongTagSize;
    }
    else if (versionLongTagSize > m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }
    else
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }

    // byte 32-35: MAJOR MINOR PATCH Unused

    lf_CopyVersionChar(majorVersion, buffer, position);
    lf_CopyVersionChar(minorVersion, buffer, position);
    lf_CopyVersionChar(patchVersion, buffer, position);
    ++position;

    // Note: Reader does process and use bytes 36-38 in
    // BP4Deserialize.cpp::ParseMetadataIndex().
    // Order and position must match there.

    // byte 36: endianness
    if (position != m_EndianFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Endian Flag "
                                          "position mismatch");
    }
    const uint8_t endianness = helper::IsLittleEndian() ? 0 : 1;
    helper::CopyToBuffer(buffer, position, &endianness);

    // byte 37: BP Version 4
    if (position != m_BPVersionPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t version = 4;
    helper::CopyToBuffer(buffer, position, &version);

    // byte 38: Active flag (used in Index Table only)
    if (position != m_ActiveFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t activeFlag = (isActive ? 1 : 0);
    helper::CopyToBuffer(buffer, position, &activeFlag);

    // byte 39: unused
    position += 1;

    // byte 40-63: unused
    position += 24;
    absolutePosition = position;
}